

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::output_three_particle_correlation_rap(singleParticleSpectra *this)

{
  ostream *poVar1;
  int i_1;
  char *pcVar2;
  int i;
  long lVar3;
  int j;
  long lVar4;
  int j_1;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_1550;
  double local_1548;
  double local_1540;
  double local_1538;
  double local_1528;
  char *local_1520 [4];
  ofstream output_ss2;
  undefined8 auStack_14f8 [2];
  uint auStack_14e8 [122];
  ofstream output_os1;
  undefined8 auStack_12f8 [2];
  uint auStack_12e8 [122];
  ofstream output_ss1;
  undefined8 auStack_10f8 [2];
  uint auStack_10e8 [122];
  ofstream output_os2;
  undefined8 auStack_ef8 [2];
  uint auStack_ee8 [122];
  ofstream output2;
  undefined8 auStack_cf8 [2];
  uint auStack_ce8 [122];
  ofstream output1;
  undefined8 auStack_af8 [2];
  uint auStack_ae8 [122];
  ostringstream filename_os2;
  ostringstream filename_os1;
  ostringstream filename_ss2;
  ostringstream filename_ss1;
  ostringstream filename2;
  ostringstream filename1;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename2);
  poVar1 = std::operator<<((ostream *)&filename1,(string *)this);
  poVar1 = std::operator<<(poVar1,"/particle_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  poVar1 = std::operator<<(poVar1,"_Cmnk_eta12");
  std::operator<<(poVar1,"_pT_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::operator<<(poVar1,"_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::operator<<(poVar1,".dat");
  poVar1 = std::operator<<((ostream *)&filename2,(string *)this);
  poVar1 = std::operator<<(poVar1,"/particle_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  poVar1 = std::operator<<(poVar1,"_Cmnk_eta13");
  std::operator<<(poVar1,"_pT_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::operator<<(poVar1,"_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::operator<<(poVar1,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output1,_output2,_S_out);
  std::__cxx11::string::~string((string *)&output2);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output2,_output_ss1,_S_out);
  std::__cxx11::string::~string((string *)&output_ss1);
  if (this->rap_type == 0) {
    poVar1 = std::operator<<((ostream *)&output1,"# eta12  C_nmk  C_nmk_err ");
    poVar1 = std::operator<<(poVar1,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar2 = "# eta13  C_nmk  C_nmk_err ";
  }
  else {
    poVar1 = std::operator<<((ostream *)&output1,"# y12  C_nmk  C_nmk_err ");
    poVar1 = std::operator<<(poVar1,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar2 = "# y13  C_nmk  C_nmk_err ";
  }
  poVar1 = std::operator<<((ostream *)&output2,pcVar2);
  poVar1 = std::operator<<(poVar1,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar4 = 0; lVar4 < this->N_rap; lVar4 = lVar4 + 1) {
    dVar12 = (double)(int)lVar4 * this->drap + this->rapidity_dis_min;
    dVar7 = (double)this->total_number_of_events;
    dVar8 = *(double *)
             (*(long *)&(((this->C_nmk_eta12).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7;
    dVar6 = *(double *)
             (*(long *)&(((this->C_nmk_eta12_err).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7 - dVar8 * dVar8;
    local_1550 = 0.0;
    if (0.0 < dVar6) {
      dVar6 = dVar6 / dVar7;
      if (dVar6 < 0.0) {
        local_1550 = sqrt(dVar6);
      }
      else {
        local_1550 = SQRT(dVar6);
      }
    }
    *(uint *)((long)auStack_ae8 + *(long *)(_output1 + -0x18)) =
         *(uint *)((long)auStack_ae8 + *(long *)(_output1 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_af8 + *(long *)(_output1 + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_af8 + *(long *)(_output1 + -0x18)) = 8;
    poVar1 = std::ostream::_M_insert<double>(dVar12);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_1550);
    std::operator<<(poVar1,"  ");
    dVar7 = (double)this->total_number_of_events;
    dVar9 = *(double *)
             (*(long *)&(((this->C_nmk_eta13).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7;
    dVar6 = *(double *)
             (*(long *)&(((this->C_nmk_eta13_err).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7 - dVar9 * dVar9;
    local_1550 = 0.0;
    if (0.0 < dVar6) {
      dVar6 = dVar6 / dVar7;
      if (dVar6 < 0.0) {
        local_1550 = sqrt(dVar6);
      }
      else {
        local_1550 = SQRT(dVar6);
      }
    }
    *(uint *)((long)auStack_ce8 + *(long *)(_output2 + -0x18)) =
         *(uint *)((long)auStack_ce8 + *(long *)(_output2 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_cf8 + *(long *)(_output2 + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_cf8 + *(long *)(_output2 + -0x18)) = 8;
    poVar1 = std::ostream::_M_insert<double>(dVar12);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar9);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_1550);
    std::operator<<(poVar1,"  ");
    lVar5 = 0x18;
    for (lVar3 = 1; lVar3 < this->num_corr; lVar3 = lVar3 + 1) {
      dVar7 = (double)this->total_number_of_events;
      dVar12 = *(double *)
                (*(long *)((long)&(((this->C_nmk_eta12).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
      dVar6 = *(double *)
               (*(long *)((long)&(((this->C_nmk_eta12_err).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
              dVar12 * dVar12;
      local_1550 = 0.0;
      if (0.0 < dVar6) {
        dVar6 = dVar6 / dVar7;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        local_1550 = dVar6 / dVar8;
      }
      *(uint *)((long)auStack_ae8 + *(long *)(_output1 + -0x18)) =
           *(uint *)((long)auStack_ae8 + *(long *)(_output1 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_af8 + *(long *)(_output1 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_af8 + *(long *)(_output1 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar12 / dVar8);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1550);
      std::operator<<(poVar1,"  ");
      dVar7 = (double)this->total_number_of_events;
      dVar12 = *(double *)
                (*(long *)((long)&(((this->C_nmk_eta13).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
      dVar6 = *(double *)
               (*(long *)((long)&(((this->C_nmk_eta13_err).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
              dVar12 * dVar12;
      local_1550 = 0.0;
      if (0.0 < dVar6) {
        dVar6 = dVar6 / dVar7;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        local_1550 = dVar6 / dVar9;
      }
      *(uint *)((long)auStack_ce8 + *(long *)(_output2 + -0x18)) =
           *(uint *)((long)auStack_ce8 + *(long *)(_output2 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_cf8 + *(long *)(_output2 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_cf8 + *(long *)(_output2 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar12 / dVar9);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1550);
      std::operator<<(poVar1,"  ");
      lVar5 = lVar5 + 0x18;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&output1);
    std::endl<char,std::char_traits<char>>((ostream *)&output2);
  }
  std::ofstream::close();
  std::ofstream::close();
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_ss1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_ss2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_os1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_os2);
    poVar1 = std::operator<<((ostream *)&filename_ss1,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::operator<<(poVar1,"_Cmnk_eta12_ss_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    poVar1 = std::operator<<((ostream *)&filename_os1,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::operator<<(poVar1,"_Cmnk_eta12_os_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    poVar1 = std::operator<<((ostream *)&filename_ss2,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::operator<<(poVar1,"_Cmnk_eta13_ss_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    poVar1 = std::operator<<((ostream *)&filename_os2,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::operator<<(poVar1,"_Cmnk_eta13_os_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_ss1,_output_os1,_S_out);
    std::__cxx11::string::~string((string *)&output_os1);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_os1,_output_ss2,_S_out);
    std::__cxx11::string::~string((string *)&output_ss2);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_ss2,_output_os2,_S_out);
    std::__cxx11::string::~string((string *)&output_os2);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_os2,local_1520[0],_S_out);
    std::__cxx11::string::~string((string *)local_1520);
    if (this->rap_type == 0) {
      poVar1 = std::operator<<((ostream *)&output_ss1,"# eta12  C_nmk_ss  C_nmk_ss_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&output_os1,"# eta12  C_nmk_os  C_nmk_os_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&output_ss2,"# eta13  C_nmk_ss  C_nmk_ss_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "# eta13  C_nmk_os  C_nmk_os_err";
    }
    else {
      poVar1 = std::operator<<((ostream *)&output_ss1,"# y12  C_nmk_ss  C_nmk_ss_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&output_os1,"# y12  C_nmk_os  C_nmk_os_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&output_ss2,"# y13  C_nmk_ss  C_nmk_ss_err");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar2 = "# y13  C_nmk_os  C_nmk_os_err";
    }
    poVar1 = std::operator<<((ostream *)&output_os2,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (lVar4 = 0; lVar4 < this->N_rap; lVar4 = lVar4 + 1) {
      dVar6 = (double)(int)lVar4 * this->drap + this->rapidity_dis_min;
      dVar8 = (double)this->total_number_of_events;
      dVar12 = *(double *)
                (*(long *)&(((this->C_nmk_eta12_ss).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta12_ss_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar12 * dVar12;
      local_1540 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1540 = sqrt(dVar7);
        }
        else {
          local_1540 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_10e8 + *(long *)(_output_ss1 + -0x18)) =
           *(uint *)((long)auStack_10e8 + *(long *)(_output_ss1 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_10f8 + *(long *)(_output_ss1 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_10f8 + *(long *)(_output_ss1 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar12);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1540);
      std::operator<<(poVar1,"  ");
      dVar8 = (double)this->total_number_of_events;
      dVar9 = *(double *)
               (*(long *)&(((this->C_nmk_eta12_os).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta12_os_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar9 * dVar9;
      local_1548 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1548 = sqrt(dVar7);
        }
        else {
          local_1548 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_12e8 + *(long *)(_output_os1 + -0x18)) =
           *(uint *)((long)auStack_12e8 + *(long *)(_output_os1 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_12f8 + *(long *)(_output_os1 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_12f8 + *(long *)(_output_os1 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar9);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1548);
      std::operator<<(poVar1,"  ");
      dVar8 = (double)this->total_number_of_events;
      dVar10 = *(double *)
                (*(long *)&(((this->C_nmk_eta13_ss).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta13_ss_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar10 * dVar10;
      local_1538 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1538 = sqrt(dVar7);
        }
        else {
          local_1538 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_14e8 + *(long *)(_output_ss2 + -0x18)) =
           *(uint *)((long)auStack_14e8 + *(long *)(_output_ss2 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_14f8 + *(long *)(_output_ss2 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_14f8 + *(long *)(_output_ss2 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar10);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1538);
      std::operator<<(poVar1,"  ");
      dVar8 = (double)this->total_number_of_events;
      dVar11 = *(double *)
                (*(long *)&(((this->C_nmk_eta13_os).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta13_os_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar11 * dVar11;
      local_1528 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1528 = sqrt(dVar7);
        }
        else {
          local_1528 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_ee8 + *(long *)(_output_os2 + -0x18)) =
           *(uint *)((long)auStack_ee8 + *(long *)(_output_os2 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_ef8 + *(long *)(_output_os2 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_ef8 + *(long *)(_output_os2 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar11);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_1528);
      std::operator<<(poVar1,"  ");
      lVar5 = 0x18;
      for (lVar3 = 1; lVar3 < this->num_corr; lVar3 = lVar3 + 1) {
        dVar7 = (double)this->total_number_of_events;
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta12_ss).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
        dVar6 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta12_ss_err).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
                dVar8 * dVar8;
        local_1550 = 0.0;
        if (0.0 < dVar6) {
          dVar6 = dVar6 / dVar7;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_1550 = dVar6 / dVar12;
        }
        *(uint *)((long)auStack_10e8 + *(long *)(_output_ss1 + -0x18)) =
             *(uint *)((long)auStack_10e8 + *(long *)(_output_ss1 + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_10f8 + *(long *)(_output_ss1 + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_10f8 + *(long *)(_output_ss1 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar8 / dVar12);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_1550);
        std::operator<<(poVar1,"  ");
        dVar7 = (double)this->total_number_of_events;
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta12_os).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
        dVar6 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta12_os_err).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
                dVar8 * dVar8;
        local_1550 = 0.0;
        if (0.0 < dVar6) {
          dVar6 = dVar6 / dVar7;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_1550 = dVar6 / dVar9;
        }
        *(uint *)((long)auStack_12e8 + *(long *)(_output_os1 + -0x18)) =
             *(uint *)((long)auStack_12e8 + *(long *)(_output_os1 + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_12f8 + *(long *)(_output_os1 + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_12f8 + *(long *)(_output_os1 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar8 / dVar9);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_1550);
        std::operator<<(poVar1,"  ");
        dVar7 = (double)this->total_number_of_events;
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta13_ss).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
        dVar6 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta13_ss_err).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
                dVar8 * dVar8;
        local_1550 = 0.0;
        if (0.0 < dVar6) {
          dVar6 = dVar6 / dVar7;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_1550 = dVar6 / dVar10;
        }
        *(uint *)((long)auStack_14e8 + *(long *)(_output_ss2 + -0x18)) =
             *(uint *)((long)auStack_14e8 + *(long *)(_output_ss2 + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_14f8 + *(long *)(_output_ss2 + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_14f8 + *(long *)(_output_ss2 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar8 / dVar10);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_1550);
        std::operator<<(poVar1,"  ");
        dVar7 = (double)this->total_number_of_events;
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta13_os).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7;
        dVar6 = *(double *)
                 (*(long *)((long)&(((this->C_nmk_eta13_os_err).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) / dVar7 -
                dVar8 * dVar8;
        local_1550 = 0.0;
        if (0.0 < dVar6) {
          dVar6 = dVar6 / dVar7;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_1550 = dVar6 / dVar11;
        }
        *(uint *)((long)auStack_ee8 + *(long *)(_output_os2 + -0x18)) =
             *(uint *)((long)auStack_ee8 + *(long *)(_output_os2 + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_ef8 + *(long *)(_output_os2 + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_ef8 + *(long *)(_output_os2 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar8 / dVar11);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_1550);
        std::operator<<(poVar1,"  ");
        lVar5 = lVar5 + 0x18;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&output_ss1);
      std::endl<char,std::char_traits<char>>((ostream *)&output_os1);
      std::endl<char,std::char_traits<char>>((ostream *)&output_ss2);
      std::endl<char,std::char_traits<char>>((ostream *)&output_os2);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&output_os2);
    std::ofstream::~ofstream(&output_ss2);
    std::ofstream::~ofstream(&output_os1);
    std::ofstream::~ofstream(&output_ss1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_os2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_os1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_ss2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_ss1);
  }
  std::ofstream::~ofstream(&output2);
  std::ofstream::~ofstream(&output1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename1);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation_rap() {
    ostringstream filename1, filename2;
    filename1 << path_ << "/particle_" << particle_monval << "_Cmnk_eta12"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    filename2 << path_ << "/particle_" << particle_monval << "_Cmnk_eta13"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    ofstream output1(filename1.str().c_str());
    ofstream output2(filename2.str().c_str());
    if (rap_type == 0) {
        output1 << "# eta12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# eta13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    } else {
        output1 << "# y12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# y13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    }

    for (int j = 0; j < N_rap; j++) {
        double eta_local = rapidity_dis_min + j * drap;
        double num_pair = C_nmk_eta12[0][j] / total_number_of_events;
        double num_pair_stdsq =
            (C_nmk_eta12_err[0][j] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output1 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair << "  " << num_pair_err << "  ";
        double num_pair_2 = C_nmk_eta13[0][j] / total_number_of_events;
        double num_pair_2_stdsq =
            (C_nmk_eta13_err[0][j] / total_number_of_events
             - num_pair_2 * num_pair_2);
        num_pair_err = 0.0;
        if (num_pair_2_stdsq > 0) {
            num_pair_err = sqrt(num_pair_2_stdsq / total_number_of_events);
        }
        output2 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair_2 << "  " << num_pair_err << "  ";
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_avg = C_nmk_eta12[i][j] / total_number_of_events;
            double Cnmk_stdsq =
                (C_nmk_eta12_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair;
            double Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair;
            }
            output1 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
            Cnmk_avg = C_nmk_eta13[i][j] / total_number_of_events;
            Cnmk_stdsq =
                (C_nmk_eta13_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair_2;
            Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair_2;
            }
            Cnmk_stdsq = Cnmk_stdsq / num_pair;
            output2 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
        }
        output1 << endl;
        output2 << endl;
    }
    output1.close();
    output2.close();
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss1, filename_ss2;
        ostringstream filename_os1, filename_os2;
        filename_ss1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_ss2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss1(filename_ss1.str().c_str());
        ofstream output_os1(filename_os1.str().c_str());
        ofstream output_ss2(filename_ss2.str().c_str());
        ofstream output_os2(filename_os2.str().c_str());
        if (rap_type == 0) {
            output_ss1 << "# eta12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# eta12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# eta13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# eta13  C_nmk_os  C_nmk_os_err" << endl;
        } else {
            output_ss1 << "# y12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# y12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# y13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# y13  C_nmk_os  C_nmk_os_err" << endl;
        }

        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;
            double num_pair_ss = C_nmk_eta12_ss[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (C_nmk_eta12_ss_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss << "  " << num_pair_ss_err
                       << "  ";
            double num_pair_os = C_nmk_eta12_os[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (C_nmk_eta12_os_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os << "  " << num_pair_os_err
                       << "  ";
            double num_pair_ss2 = C_nmk_eta13_ss[0][j] / total_number_of_events;
            double num_pair_ss2_stdsq =
                (C_nmk_eta13_ss_err[0][j] / total_number_of_events
                 - num_pair_ss2 * num_pair_ss2);
            double num_pair_ss2_err = 0.0;
            if (num_pair_ss2_stdsq > 0) {
                num_pair_ss2_err =
                    (sqrt(num_pair_ss2_stdsq / total_number_of_events));
            }
            output_ss2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss2 << "  " << num_pair_ss2_err
                       << "  ";
            double num_pair_os2 = C_nmk_eta13_os[0][j] / total_number_of_events;
            double num_pair_os2_stdsq =
                (C_nmk_eta13_os_err[0][j] / total_number_of_events
                 - num_pair_os2 * num_pair_os2);
            double num_pair_os2_err = 0.0;
            if (num_pair_os2_stdsq > 0) {
                num_pair_os2_err =
                    (sqrt(num_pair_os2_stdsq / total_number_of_events));
            }
            output_os2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os2 << "  " << num_pair_os2_err
                       << "  ";
            for (int i = 1; i < num_corr; i++) {
                double Cnmk_ss_avg =
                    (C_nmk_eta12_ss[i][j] / total_number_of_events);
                double Cnmk_ss_stdsq =
                    (C_nmk_eta12_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
                double Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
                }
                output_ss1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                double Cnmk_os_avg =
                    (C_nmk_eta12_os[i][j] / total_number_of_events);
                double Cnmk_os_stdsq =
                    (C_nmk_eta12_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
                double Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os;
                }
                output_os1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
                Cnmk_ss_avg = (C_nmk_eta13_ss[i][j] / total_number_of_events);
                Cnmk_ss_stdsq =
                    (C_nmk_eta13_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss2;
                Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss2;
                }
                output_ss2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                Cnmk_os_avg = (C_nmk_eta13_os[i][j] / total_number_of_events);
                Cnmk_os_stdsq =
                    (C_nmk_eta13_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os2;
                Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os2;
                }
                output_os2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
            }
            output_ss1 << endl;
            output_os1 << endl;
            output_ss2 << endl;
            output_os2 << endl;
        }
        output_ss1.close();
        output_os1.close();
        output_ss2.close();
        output_os2.close();
    }
}